

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunlinsol.c
# Opt level: O3

int Test_SUNLinSolGetType(SUNLinearSolver S,SUNLinearSolver_Type suntype,int myid)

{
  SUNLinearSolver_Type SVar1;
  int iVar2;
  
  SVar1 = SUNLinSolGetType();
  sync_device();
  if (SVar1 == suntype) {
    if (myid != 0) {
      return 0;
    }
    puts("    PASSED test -- SUNLinSolGetType ");
    iVar2 = 0;
  }
  else {
    printf(">>> FAILED test -- SUNLinSolGetType, Proc %d \n",(ulong)(uint)myid);
    iVar2 = 1;
  }
  if (print_time != 0) {
    printf("    SUNLinSolGetType Time: %22.15e \n \n",0);
  }
  return iVar2;
}

Assistant:

int Test_SUNLinSolGetType(SUNLinearSolver S, SUNLinearSolver_Type suntype,
                          int myid)
{
  double start_time, stop_time;
  SUNLinearSolver_Type mysuntype;

  start_time = get_time();
  mysuntype  = SUNLinSolGetType(S);
  sync_device();
  stop_time = get_time();

  if (suntype != mysuntype)
  {
    printf(">>> FAILED test -- SUNLinSolGetType, Proc %d \n", myid);
    PRINT_TIME("    SUNLinSolGetType Time: %22.15e \n \n",
               stop_time - start_time);
    return (1);
  }
  else if (myid == 0)
  {
    printf("    PASSED test -- SUNLinSolGetType \n");
    PRINT_TIME("    SUNLinSolGetType Time: %22.15e \n \n",
               stop_time - start_time);
  }

  return (0);
}